

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

LY_ERR skip_section(lyxml_ctx *xmlctx,char *delim,size_t delim_len,char *sectname)

{
  ly_in *in;
  long lVar1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  long lVar6;
  
  in = xmlctx->in;
  pcVar5 = in->current;
  cVar2 = *pcVar5;
  if (cVar2 != '\0') {
    lVar6 = 0;
    lVar1 = 0;
    do {
      if (cVar2 == *delim) {
        sVar3 = 0;
        sVar4 = sVar3;
        if (delim_len != 0) {
          do {
            sVar4 = sVar3;
            if (pcVar5[sVar3] != delim[sVar3]) break;
            sVar3 = sVar3 + 1;
            sVar4 = delim_len;
          } while (delim_len != sVar3);
        }
        if (sVar4 == delim_len) {
          in->line = in->line + lVar6;
          ly_in_skip(in,lVar1 + delim_len);
          return LY_SUCCESS;
        }
      }
      else {
        lVar6 = lVar6 + (ulong)(cVar2 == '\n');
      }
      lVar1 = lVar1 + 1;
      cVar2 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    } while (cVar2 != '\0');
  }
  ly_vlog(xmlctx->ctx,(char *)0x0,LYVE_SYNTAX,"%s not terminated.",sectname);
  return LY_EVALID;
}

Assistant:

LY_ERR
skip_section(struct lyxml_ctx *xmlctx, const char *delim, size_t delim_len, const char *sectname)
{
    size_t i;
    register const char *input, *a, *b;
    uint64_t parsed = 0, newlines = 0;

    for (input = xmlctx->in->current; *input; ++input, ++parsed) {
        if (*input != *delim) {
            if (*input == '\n') {
                ++newlines;
            }
            continue;
        }
        a = input;
        b = delim;
        for (i = 0; i < delim_len; ++i) {
            if (*a++ != *b++) {
                break;
            }
        }
        if (i == delim_len) {
            /* delim found */
            xmlctx->in->line += newlines;
            ly_in_skip(xmlctx->in, parsed + delim_len);
            return LY_SUCCESS;
        }
    }

    /* delim not found,
     * do not update input handler to refer to the beginning of the section in error message */
    LOGVAL(xmlctx->ctx, LY_VCODE_NTERM, sectname);
    return LY_EVALID;
}